

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressTestUtil.cpp
# Opt level: O3

ProgramContext * __thiscall
deqp::gls::LongStressTestUtil::ProgramLibrary::generateBufferAndTextureContext
          (ProgramContext *__return_storage_ptr__,ProgramLibrary *this,int numTextures,int texWid,
          int texHei)

{
  vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *this_01;
  undefined8 vtxShaderSource_;
  undefined8 *puVar3;
  long *plVar4;
  mapped_type *pmVar5;
  size_type *psVar6;
  ulong *puVar7;
  long *plVar8;
  ulong uVar9;
  float fVar10;
  string vtxTexCoordOutputs;
  string fragTexCoordInputs;
  string vtxTexCoordWrites;
  ProgramContext *context;
  string fragColorExpression;
  string fragSamplers;
  ostringstream s;
  string vtxTexCoordInputs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  firstLevelParams;
  key_type local_480;
  long *local_460;
  undefined8 local_458;
  long local_450;
  undefined8 uStack_448;
  ulong *local_440;
  long local_438;
  ulong local_430;
  long lStack_428;
  string local_420;
  float local_3fc;
  ulong *local_3f8;
  long local_3f0;
  ulong local_3e8;
  long lStack_3e0;
  string local_3d8;
  long *local_3b8;
  long local_3b0;
  long local_3a8;
  long lStack_3a0;
  string local_398;
  long *local_378;
  long local_370;
  long local_368;
  long lStack_360;
  ProgramContext *local_358;
  undefined1 *local_350;
  long local_348;
  undefined1 local_340;
  undefined7 uStack_33f;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *local_330;
  int local_328;
  int local_324;
  ulong *local_320;
  long local_318;
  ulong local_310 [2];
  ulong *local_300;
  long local_2f8;
  ulong local_2f0 [2];
  string local_2e0;
  undefined1 *local_2c0;
  undefined8 local_2b8;
  undefined1 local_2b0;
  undefined7 uStack_2af;
  undefined1 local_2a0 [376];
  VarSpec local_128;
  vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fVar10 = 0.0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
  local_128.name._M_string_length = 0;
  local_128.name.field_2._M_local_buf[0] = '\0';
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  local_420._M_string_length = 0;
  local_420.field_2._M_allocated_capacity =
       local_420.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  local_398._M_string_length = 0;
  local_398.field_2._M_local_buf[0] = '\0';
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  local_3d8._M_string_length = 0;
  local_3d8.field_2._M_local_buf[0] = '\0';
  local_2c0 = &local_2b0;
  local_2b8 = 0;
  local_2b0 = 0;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  local_2e0._M_string_length = 0;
  local_2e0.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_480.field_2;
  local_3fc = (float)numTextures;
  local_358 = __return_storage_ptr__;
  local_330 = (vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *)this;
  local_328 = texWid;
  local_324 = texHei;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < numTextures) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0xb56c3b)
      ;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_450 = *plVar4;
        uStack_448 = puVar3[3];
        local_460 = &local_450;
      }
      else {
        local_450 = *plVar4;
        local_460 = (long *)*puVar3;
      }
      local_458 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_460);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480.field_2._8_8_ = plVar4[3];
        local_480._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_480._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_480._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar1) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0xb56c5d)
      ;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_450 = *plVar4;
        uStack_448 = puVar3[3];
        local_460 = &local_450;
      }
      else {
        local_450 = *plVar4;
        local_460 = (long *)*puVar3;
      }
      local_458 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_460);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480.field_2._8_8_ = plVar4[3];
        local_480._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_480._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_480._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar1) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_378,0,(char *)0x0,0xb56c80);
      local_3f8 = &local_3e8;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_3e8 = *puVar7;
        lStack_3e0 = plVar4[3];
      }
      else {
        local_3e8 = *puVar7;
        local_3f8 = (ulong *)*plVar4;
      }
      local_3f0 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3f8);
      local_3b8 = &local_3a8;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_3a8 = *plVar8;
        lStack_3a0 = plVar4[3];
      }
      else {
        local_3a8 = *plVar8;
        local_3b8 = (long *)*plVar4;
      }
      local_3b0 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      local_440 = &local_430;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_430 = *puVar7;
        lStack_428 = plVar4[3];
      }
      else {
        local_430 = *puVar7;
        local_440 = (ulong *)*plVar4;
      }
      local_438 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      uVar9 = 0xf;
      if (local_440 != &local_430) {
        uVar9 = local_430;
      }
      if (uVar9 < (ulong)(local_348 + local_438)) {
        uVar9 = 0xf;
        if (local_350 != &local_340) {
          uVar9 = CONCAT71(uStack_33f,local_340);
        }
        if (uVar9 < (ulong)(local_348 + local_438)) goto LAB_008f452b;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,(ulong)local_440);
      }
      else {
LAB_008f452b:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_350);
      }
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_450 = *plVar4;
        uStack_448 = puVar3[3];
        local_460 = &local_450;
      }
      else {
        local_450 = *plVar4;
        local_460 = (long *)*puVar3;
      }
      local_458 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_460);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480.field_2._8_8_ = plVar4[3];
        local_480._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_480._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_398,(ulong)local_480._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar1) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,local_3a8 + 1);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,local_3e8 + 1);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378,local_368 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0xb56c8c)
      ;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_450 = *plVar4;
        uStack_448 = puVar3[3];
        local_460 = &local_450;
      }
      else {
        local_450 = *plVar4;
        local_460 = (long *)*puVar3;
      }
      local_458 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_460);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480.field_2._8_8_ = plVar4[3];
        local_480._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_480._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_3d8,(ulong)local_480._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar1) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0xb56caf)
      ;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_450 = *plVar4;
        uStack_448 = puVar3[3];
        local_460 = &local_450;
      }
      else {
        local_450 = *plVar4;
        local_460 = (long *)*puVar3;
      }
      local_458 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_460);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480.field_2._8_8_ = plVar4[3];
        local_480._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_480._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2c0,(ulong)local_480._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar1) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      local_350 = &local_340;
      local_348 = 0;
      local_340 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_350);
      local_378 = &local_368;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_368 = *plVar8;
        lStack_360 = plVar4[3];
      }
      else {
        local_368 = *plVar8;
        local_378 = (long *)*plVar4;
      }
      local_370 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_3f8 = &local_3e8;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_3e8 = *puVar7;
        lStack_3e0 = plVar4[3];
      }
      else {
        local_3e8 = *puVar7;
        local_3f8 = (ulong *)*plVar4;
      }
      local_3f0 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      uVar9 = 0xf;
      if (local_3f8 != &local_3e8) {
        uVar9 = local_3e8;
      }
      if (uVar9 < (ulong)(local_2f8 + local_3f0)) {
        uVar9 = 0xf;
        if (local_300 != local_2f0) {
          uVar9 = local_2f0[0];
        }
        if (uVar9 < (ulong)(local_2f8 + local_3f0)) goto LAB_008f4b18;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,(ulong)local_3f8);
      }
      else {
LAB_008f4b18:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_300);
      }
      local_3b8 = &local_3a8;
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_3a8 = *plVar4;
        lStack_3a0 = puVar3[3];
      }
      else {
        local_3a8 = *plVar4;
        local_3b8 = (long *)*puVar3;
      }
      local_3b0 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_3b8);
      local_440 = &local_430;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_430 = *puVar7;
        lStack_428 = plVar4[3];
      }
      else {
        local_430 = *puVar7;
        local_440 = (ulong *)*plVar4;
      }
      local_438 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((ostringstream *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      uVar9 = 0xf;
      if (local_440 != &local_430) {
        uVar9 = local_430;
      }
      if (uVar9 < (ulong)(local_318 + local_438)) {
        uVar9 = 0xf;
        if (local_320 != local_310) {
          uVar9 = local_310[0];
        }
        if (uVar9 < (ulong)(local_318 + local_438)) goto LAB_008f4c83;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_440);
      }
      else {
LAB_008f4c83:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_320);
      }
      plVar4 = puVar3 + 2;
      if ((long *)*puVar3 == plVar4) {
        local_450 = *plVar4;
        uStack_448 = puVar3[3];
        local_460 = &local_450;
      }
      else {
        local_450 = *plVar4;
        local_460 = (long *)*puVar3;
      }
      local_458 = puVar3[1];
      *puVar3 = plVar4;
      puVar3[1] = 0;
      *(undefined1 *)plVar4 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_460);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480.field_2._8_8_ = plVar4[3];
        local_480._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_480.field_2._M_allocated_capacity = *psVar6;
        local_480._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_480._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_480._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != paVar1) {
        operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
      }
      if (local_460 != &local_450) {
        operator_delete(local_460,local_450 + 1);
      }
      if (local_320 != local_310) {
        operator_delete(local_320,local_310[0] + 1);
      }
      if (local_440 != &local_430) {
        operator_delete(local_440,local_430 + 1);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8,local_3a8 + 1);
      }
      if (local_300 != local_2f0) {
        operator_delete(local_300,local_2f0[0] + 1);
      }
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,local_3e8 + 1);
      }
      if (local_378 != &local_368) {
        operator_delete(local_378,local_368 + 1);
      }
      if (local_350 != &local_340) {
        operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
      }
      fVar10 = (float)((int)fVar10 + 1);
    } while (local_3fc != fVar10);
  }
  this_01 = local_330;
  substitute((string *)local_2a0,(ProgramLibrary *)local_330,&local_128.name);
  local_480._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"VTX_TEX_COORD_INPUTS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_78,&local_480);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != paVar1) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_2a0 + 0x10;
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  substitute((string *)local_2a0,(ProgramLibrary *)this_01,&local_420);
  local_480._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"VTX_TEX_COORD_OUTPUTS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_78,&local_480);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != paVar1) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"VTX_TEX_COORD_WRITES","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_78,(key_type *)local_2a0);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  substitute((string *)local_2a0,(ProgramLibrary *)this_01,&local_3d8);
  local_480._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"FRAG_TEX_COORD_INPUTS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_78,&local_480);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != paVar1) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  local_2a0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2a0,"FRAG_SAMPLERS","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_78,(key_type *)local_2a0);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  substitute((string *)local_2a0,(ProgramLibrary *)this_01,&local_2e0);
  local_480._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"FRAG_COLOR_EXPRESSION","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_78,&local_480);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != paVar1) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,
                    CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                             local_2e0.field_2._M_local_buf[0]) + 1);
  }
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0,CONCAT71(uStack_2af,local_2b0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,
                    CONCAT71(local_3d8.field_2._M_allocated_capacity._1_7_,
                             local_3d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,
                    CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                             local_398.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name._M_dataplus._M_p != &local_128.name.field_2) {
    operator_delete(local_128.name._M_dataplus._M_p,
                    CONCAT71(local_128.name.field_2._M_allocated_capacity._1_7_,
                             local_128.name.field_2._M_local_buf[0]) + 1);
  }
  local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,
             "${VTX_HEADER}${VTX_IN} highp vec3 a_position;\n${VTX_TEX_COORD_INPUTS}${VTX_TEX_COORD_OUTPUTS}\nvoid main (void)\n{\n\tgl_Position = vec4(a_position, 1.0);\n${VTX_TEX_COORD_WRITES}}\n"
             ,"");
  substitute((string *)local_2a0,(ProgramLibrary *)this_01,&local_128.name,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_78);
  vtxShaderSource_ = local_2a0._0_8_;
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_398,
             "${FRAG_HEADER}${FRAG_TEX_COORD_INPUTS}${FRAG_SAMPLERS}\nvoid main (void)\n{\n\t${FRAG_COLOR} =${FRAG_COLOR_EXPRESSION};\n}\n"
             ,"");
  substitute(&local_420,(ProgramLibrary *)this_01,&local_398,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_78);
  ProgramContext::ProgramContext
            (local_358,(char *)vtxShaderSource_,local_420._M_dataplus._M_p,"a_position");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,
                    CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                             local_398.field_2._M_local_buf[0]) + 1);
  }
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name._M_dataplus._M_p != &local_128.name.field_2) {
    operator_delete(local_128.name._M_dataplus._M_p,
                    CONCAT71(local_128.name.field_2._M_allocated_capacity._1_7_,
                             local_128.name.field_2._M_local_buf[0]) + 1);
  }
  local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"a_position","");
  local_420._M_dataplus._M_p = (pointer)0xbdcccccdbdcccccd;
  local_420._M_string_length = CONCAT44(local_420._M_string_length._4_4_,0xbdcccccd);
  local_398._M_dataplus._M_p = (pointer)0x3dcccccd3dcccccd;
  local_398._M_string_length = CONCAT44(local_398._M_string_length._4_4_,0x3dcccccd);
  VarSpec::VarSpec<tcu::Vector<float,3>>
            ((VarSpec *)local_2a0,&local_128.name,(Vector<float,_3> *)&local_420,
             (Vector<float,_3> *)&local_398);
  local_330 = &local_358->attributes;
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
  emplace_back<deqp::gls::VarSpec>(local_330,(VarSpec *)local_2a0);
  if ((char *)local_2a0._0_8_ != pcVar2) {
    operator_delete((void *)local_2a0._0_8_,local_2a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.name._M_dataplus._M_p != &local_128.name.field_2) {
    operator_delete(local_128.name._M_dataplus._M_p,
                    CONCAT71(local_128.name.field_2._M_allocated_capacity._1_7_,
                             local_128.name.field_2._M_local_buf[0]) + 1);
  }
  if (0 < (int)local_3fc) {
    local_80 = &local_358->uniforms;
    local_48 = 1.0 / (float)(int)local_3fc;
    this_00 = &local_358->textureSpecs;
    fVar10 = 0.0;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((TextureSpec *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,0xb56c52);
      local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_420.field_2._M_allocated_capacity = *psVar6;
        local_420.field_2._8_8_ = plVar4[3];
      }
      else {
        local_420.field_2._M_allocated_capacity = *psVar6;
        local_420._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_420._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_2a0._0_8_ = (pointer)0x0;
      local_3d8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
      VarSpec::VarSpec<tcu::Vector<float,2>>
                (&local_128,&local_420,(Vector<float,_2> *)local_2a0,(Vector<float,_2> *)&local_3d8)
      ;
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
      emplace_back<deqp::gls::VarSpec>(local_330,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.name._M_dataplus._M_p != &local_128.name.field_2) {
        operator_delete(local_128.name._M_dataplus._M_p,
                        CONCAT71(local_128.name.field_2._M_allocated_capacity._1_7_,
                                 local_128.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,
                        CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                                 local_398.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
      std::ostream::operator<<((TextureSpec *)local_2a0,(int)fVar10);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
      std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x70));
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_398,0,(char *)0x0,0xb2e2de);
      local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_420.field_2._M_allocated_capacity = *puVar7;
        local_420.field_2._8_8_ = plVar4[3];
      }
      else {
        local_420.field_2._M_allocated_capacity = *puVar7;
        local_420._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_420._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_128.name._M_dataplus._M_p = (pointer)&local_128.name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_420._M_dataplus._M_p,
                 local_420._M_dataplus._M_p + local_420._M_string_length);
      local_128.type = TYPE_INT;
      local_128.minValue.i[0] = (int)fVar10;
      local_128.maxValue._0_4_ = fVar10;
      std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::
      emplace_back<deqp::gls::VarSpec>(local_80,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.name._M_dataplus._M_p != &local_128.name.field_2) {
        operator_delete(local_128.name._M_dataplus._M_p,
                        CONCAT71(local_128.name.field_2._M_allocated_capacity._1_7_,
                                 local_128.name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_420._M_dataplus._M_p != &local_420.field_2) {
        operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,
                        CONCAT71(local_398.field_2._M_allocated_capacity._1_7_,
                                 local_398.field_2._M_local_buf[0]) + 1);
      }
      local_2a0._0_8_ = (ulong)(uint)fVar10 << 0x20;
      local_2a0._8_4_ = local_328;
      local_2a0._12_4_ = local_324;
      local_2a0._16_8_ = 0x140100001908;
      local_2a0._24_4_ = 0x1908;
      local_2a0[0x1c] = '\x01';
      local_2a0._32_8_ = 0x260100002703;
      local_2a0._40_8_ = 0x290100002901;
      local_2a0._48_8_ = 0;
      local_2a0._56_8_ = 0;
      local_2a0._64_8_ = CONCAT44(fStack_44,local_48);
      local_2a0._72_8_ = CONCAT44(fStack_3c,fStack_40);
      std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::
      emplace_back<deqp::gls::TextureSpec>(this_00,(TextureSpec *)local_2a0);
      fVar10 = (float)((int)fVar10 + 1);
    } while (local_3fc != fVar10);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_78);
  return local_358;
}

Assistant:

gls::ProgramContext ProgramLibrary::generateBufferAndTextureContext (const int numTextures, const int texWid, const int texHei) const
{
	static const char* const vertexTemplate =
		"${VTX_HEADER}"
		"${VTX_IN} highp vec3 a_position;\n"
		"${VTX_TEX_COORD_INPUTS}"
		"${VTX_TEX_COORD_OUTPUTS}"
		"\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = vec4(a_position, 1.0);\n"
		"${VTX_TEX_COORD_WRITES}"
		"}\n";

	static const char* const fragmentTemplate =
		"${FRAG_HEADER}"
		"${FRAG_TEX_COORD_INPUTS}"
		"${FRAG_SAMPLERS}"
		"\n"
		"void main (void)\n"
		"{\n"
		"	${FRAG_COLOR} =${FRAG_COLOR_EXPRESSION};\n"
		"}\n";

	map<string, string> firstLevelParams;

	{
		string vtxTexCoordInputs;
		string vtxTexCoordOutputs;
		string vtxTexCoordWrites;
		string fragTexCoordInputs;
		string fragSamplers;
		string fragColorExpression;

		for (int i = 0; i < numTextures; i++)
		{
			vtxTexCoordInputs		+= "${VTX_IN} mediump vec2 a_texCoord" + toString(i) + ";\n";
			vtxTexCoordOutputs		+= "${VTX_OUT} mediump vec2 v_texCoord" + toString(i) + ";\n";
			vtxTexCoordWrites		+= "\tv_texCoord" + toString(i) + " = " + "a_texCoord" + toString(i) + ";\n";
			fragTexCoordInputs		+= "${FRAG_IN} mediump vec2 v_texCoord" + toString(i) + ";\n";
			fragSamplers			+= "uniform mediump sampler2D u_sampler" + toString(i) + ";\n";
			fragColorExpression		+= string() + (i > 0 ? " +" : "") + "\n\t\t${TEXTURE_2D_FUNC}(u_sampler" + toString(i) + ", v_texCoord" + toString(i) + ")";
		}

		firstLevelParams["VTX_TEX_COORD_INPUTS"]	= substitute(vtxTexCoordInputs);
		firstLevelParams["VTX_TEX_COORD_OUTPUTS"]	= substitute(vtxTexCoordOutputs);
		firstLevelParams["VTX_TEX_COORD_WRITES"]	= vtxTexCoordWrites;
		firstLevelParams["FRAG_TEX_COORD_INPUTS"]	= substitute(fragTexCoordInputs);
		firstLevelParams["FRAG_SAMPLERS"]			= fragSamplers;
		firstLevelParams["FRAG_COLOR_EXPRESSION"]	= substitute(fragColorExpression);
	}

	gls::ProgramContext context(substitute(vertexTemplate, firstLevelParams).c_str(), substitute(fragmentTemplate, firstLevelParams).c_str(), "a_position");

	context.attributes.push_back(gls::VarSpec("a_position", Vec3(-0.1f), Vec3(0.1f)));

	for (int i = 0; i < numTextures; i++)
	{
		context.attributes.push_back(gls::VarSpec("a_texCoord" + de::toString(i), Vec2(0.0f), Vec2(1.0f)));
		context.uniforms.push_back(gls::VarSpec("u_sampler" + de::toString(i), i));
		context.textureSpecs.push_back(gls::TextureSpec(glu::TextureTestUtil::TEXTURETYPE_2D, i,
														texWid, texHei, GL_RGBA, GL_UNSIGNED_BYTE, GL_RGBA, true,
														GL_LINEAR_MIPMAP_LINEAR, GL_LINEAR, GL_REPEAT, GL_REPEAT,
														Vec4(0.0f), Vec4(1.0f / (float)numTextures)));
	}

	return context;
}